

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O1

void __thiscall leveldb::DBTest_StillReadSST_Test::TestBody(DBTest_StillReadSST_Test *this)

{
  AssertHelperData *pAVar1;
  AssertHelper *this_00;
  DB *pDVar2;
  AssertHelperData *pAVar3;
  PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> PVar4;
  undefined8 uVar5;
  char cVar6;
  int iVar7;
  undefined8 *puVar8;
  char *pcVar9;
  char *in_R9;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_4;
  Status s;
  Options options;
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  Message local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [96];
  DB local_38;
  
  pAVar3 = (AssertHelperData *)(local_98 + 0x10);
  local_98._0_8_ = pAVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_a8 + 0x10),"foo","");
  pAVar1 = (AssertHelperData *)(local_d8 + 0x10);
  local_d8._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"bar","");
  local_a8[8] = 0;
  local_f8._8_8_ = CONCAT53(local_98._11_5_,CONCAT12(local_98[10],local_98._8_2_));
  local_f8._0_8_ = local_98._0_8_;
  local_b8.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = local_d8._0_4_;
  local_b8.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = local_d8._4_4_;
  uStack_b0 = local_d8._8_4_;
  uStack_ac = local_d8._12_4_;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(local_a8);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_f8,(char *)&local_b8
             ,(Status *)"Put(\"foo\", \"bar\")");
  if ((_func_int **)local_a8._0_8_ != (_func_int **)0x0) {
    operator_delete__((void *)local_a8._0_8_);
  }
  if ((AssertHelperData *)local_d8._0_8_ != pAVar1) {
    operator_delete((void *)local_d8._0_8_);
  }
  if ((AssertHelperData *)local_98._0_8_ != pAVar3) {
    operator_delete((void *)local_98._0_8_);
  }
  PVar4 = local_f8[0];
  if (local_f8[0] == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
    testing::Message::Message((Message *)(local_a8 + 0x10));
    if ((undefined8 *)local_f8._8_8_ == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
               ,0x73a,pcVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)local_d8,(Message *)(local_a8 + 0x10));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d8);
    if ((AssertHelperData *)local_98._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  uVar5 = local_f8._8_8_;
  if ((undefined8 *)local_f8._8_8_ != (undefined8 *)0x0) {
    if (*(undefined8 **)local_f8._8_8_ != (undefined8 *)(local_f8._8_8_ + 0x10)) {
      operator_delete(*(undefined8 **)local_f8._8_8_);
    }
    operator_delete((void *)uVar5);
  }
  if (PVar4 != (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
    local_d8._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"foo","");
    DBTest::Get((string *)(local_a8 + 0x10),&this->super_DBTest,(string *)local_d8,(Snapshot *)0x0);
    testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
              ((internal *)local_f8,"\"bar\"","Get(\"foo\")",(char (*) [4])"bar",
               (string *)(local_a8 + 0x10));
    if ((AssertHelperData *)local_98._0_8_ != pAVar3) {
      operator_delete((void *)local_98._0_8_);
    }
    if ((AssertHelperData *)local_d8._0_8_ != pAVar1) {
      operator_delete((void *)local_d8._0_8_);
    }
    PVar4 = local_f8[0];
    if (local_f8[0] == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
      testing::Message::Message((Message *)(local_a8 + 0x10));
      if ((undefined8 *)local_f8._8_8_ == (undefined8 *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = *(char **)local_f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                 ,0x73b,pcVar9);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)local_d8,(Message *)(local_a8 + 0x10));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d8);
      if ((AssertHelperData *)local_98._0_8_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_98._0_8_ + 8))();
      }
    }
    uVar5 = local_f8._8_8_;
    if ((undefined8 *)local_f8._8_8_ != (undefined8 *)0x0) {
      if (*(undefined8 **)local_f8._8_8_ != (undefined8 *)(local_f8._8_8_ + 0x10)) {
        operator_delete(*(undefined8 **)local_f8._8_8_);
      }
      operator_delete((void *)uVar5);
    }
    if (PVar4 != (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
      DBImpl::TEST_CompactMemTable((DBImpl *)&stack0xffffffffffffffc8);
      if (local_38._vptr_DB != (_func_int **)0x0) {
        operator_delete__(local_38._vptr_DB);
      }
      local_d8._0_8_ = pAVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"foo","");
      DBTest::Get((string *)(local_a8 + 0x10),&this->super_DBTest,(string *)local_d8,(Snapshot *)0x0
                 );
      testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
                ((internal *)local_f8,"\"bar\"","Get(\"foo\")",(char (*) [4])"bar",
                 (string *)(local_a8 + 0x10));
      if ((AssertHelperData *)local_98._0_8_ != pAVar3) {
        operator_delete((void *)local_98._0_8_);
      }
      if ((AssertHelperData *)local_d8._0_8_ != pAVar1) {
        operator_delete((void *)local_d8._0_8_);
      }
      PVar4 = local_f8[0];
      if (local_f8[0] == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
        testing::Message::Message((Message *)(local_a8 + 0x10));
        if ((undefined8 *)local_f8._8_8_ == (undefined8 *)0x0) {
          pcVar9 = "";
        }
        else {
          pcVar9 = *(char **)local_f8._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_d8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                   ,0x73f,pcVar9);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)local_d8,(Message *)(local_a8 + 0x10));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d8);
        if ((AssertHelperData *)local_98._0_8_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_98._0_8_ + 8))();
        }
      }
      if ((undefined8 *)local_f8._8_8_ != (undefined8 *)0x0) {
        if (*(undefined8 **)local_f8._8_8_ != (undefined8 *)(local_f8._8_8_ + 0x10)) {
          operator_delete(*(undefined8 **)local_f8._8_8_);
        }
        operator_delete((void *)local_f8._8_8_);
      }
      if (PVar4 != (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
        pDVar2 = (this->super_DBTest).db_;
        if (pDVar2 != (DB *)0x0) {
          (*pDVar2->_vptr_DB[1])();
        }
        (this->super_DBTest).db_ = (DB *)0x0;
        iVar7 = DBTest::RenameLDBToSST(&this->super_DBTest);
        local_d8._0_4_ = iVar7;
        local_f8._0_8_ = local_f8._0_8_ & 0xffffffff00000000;
        testing::internal::CmpHelperGT<int,int>
                  ((internal *)(local_a8 + 0x10),"RenameLDBToSST()","0",(int *)local_d8,
                   (int *)local_f8);
        cVar6 = local_98[0];
        if (local_98[0] == '\0') {
          testing::Message::Message((Message *)local_d8);
          puVar8 = (undefined8 *)CONCAT53(local_98._11_5_,CONCAT12(local_98[10],local_98._8_2_));
          if (puVar8 == (undefined8 *)0x0) {
            pcVar9 = "";
          }
          else {
            pcVar9 = (char *)*puVar8;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_f8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                     ,0x741,pcVar9);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_f8,(Message *)local_d8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f8);
          if ((AssertHelperData *)local_d8._0_8_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_d8._0_8_ + 8))();
          }
        }
        puVar8 = (undefined8 *)CONCAT53(local_98._11_5_,CONCAT12(local_98[10],local_98._8_2_));
        if (puVar8 != (undefined8 *)0x0) {
          if ((undefined8 *)*puVar8 != puVar8 + 2) {
            operator_delete((undefined8 *)*puVar8);
          }
          operator_delete(puVar8);
        }
        if (cVar6 != '\0') {
          DBTest::CurrentOptions((Options *)(local_a8 + 0x10),&this->super_DBTest);
          local_98[10] = 1;
          DBTest::TryReopen((DBTest *)local_a8,(Options *)this);
          local_f8[0] = (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)
                        ((_func_int **)local_a8._0_8_ == (_func_int **)0x0);
          local_f8._8_8_ = (undefined8 *)0x0;
          if ((_func_int **)local_a8._0_8_ == (_func_int **)0x0) {
            local_f8._0_8_ = (AssertHelperData *)(local_f8 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"foo","");
            DBTest::Get((string *)local_d8,&this->super_DBTest,(string *)local_f8,(Snapshot *)0x0);
            testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
                      ((internal *)&local_b8,"\"bar\"","Get(\"foo\")",(char (*) [4])"bar",
                       (string *)local_d8);
            if ((AssertHelperData *)local_d8._0_8_ != pAVar1) {
              operator_delete((void *)local_d8._0_8_);
            }
            if ((AssertHelperData *)local_f8._0_8_ != (AssertHelperData *)(local_f8 + 0x10)) {
              operator_delete((void *)local_f8._0_8_);
            }
            if (local_b8.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)local_d8);
              if ((undefined8 *)CONCAT44(uStack_ac,uStack_b0) == (undefined8 *)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = *(char **)CONCAT44(uStack_ac,uStack_b0);
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_f8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                         ,0x746,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_f8,(Message *)local_d8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f8);
              if ((AssertHelperData *)local_d8._0_8_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_d8._0_8_ + 8))();
              }
            }
            puVar8 = (undefined8 *)CONCAT44(uStack_ac,uStack_b0);
          }
          else {
            testing::Message::Message(&local_b8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_d8,(internal *)local_f8,(AssertionResult *)0x17c3f6,"false",
                       "true",in_R9);
            this_00 = (AssertHelper *)(local_a8 + 8);
            testing::internal::AssertHelper::AssertHelper
                      (this_00,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                       ,0x745,(char *)local_d8._0_8_);
            testing::internal::AssertHelper::operator=(this_00,&local_b8);
            testing::internal::AssertHelper::~AssertHelper(this_00);
            if ((AssertHelperData *)local_d8._0_8_ != pAVar1) {
              operator_delete((void *)local_d8._0_8_);
            }
            puVar8 = (undefined8 *)local_f8._8_8_;
            if ((long *)CONCAT44(local_b8.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._4_4_,
                                 (int)local_b8.ss_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_b8.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._4_4_,
                                             (int)local_b8.ss_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl) + 8))();
              puVar8 = (undefined8 *)local_f8._8_8_;
            }
          }
          if (puVar8 != (undefined8 *)0x0) {
            if ((undefined8 *)*puVar8 != puVar8 + 2) {
              operator_delete((undefined8 *)*puVar8);
            }
            operator_delete(puVar8);
          }
          if ((_func_int **)local_a8._0_8_ != (_func_int **)0x0) {
            operator_delete__((void *)local_a8._0_8_);
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(DBTest, StillReadSST) {
  ASSERT_LEVELDB_OK(Put("foo", "bar"));
  ASSERT_EQ("bar", Get("foo"));

  // Dump the memtable to disk.
  dbfull()->TEST_CompactMemTable();
  ASSERT_EQ("bar", Get("foo"));
  Close();
  ASSERT_GT(RenameLDBToSST(), 0);
  Options options = CurrentOptions();
  options.paranoid_checks = true;
  Status s = TryReopen(&options);
  ASSERT_TRUE(s.ok());
  ASSERT_EQ("bar", Get("foo"));
}